

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crash_example.cc
# Opt level: O0

void thread_sample(SimpleLogger *ll,size_t id)

{
  int iVar1;
  undefined8 in_RSI;
  SimpleLogger *in_RDI;
  size_t sec;
  string *in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee0;
  string *sec_00;
  SimpleLogger *in_stack_fffffffffffffee8;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [32];
  string *local_18;
  undefined8 local_10;
  SimpleLogger *local_8;
  
  local_18 = (string *)0x5;
  local_10 = in_RSI;
  if ((in_RDI != (SimpleLogger *)0x0) &&
     (local_8 = in_RDI, iVar1 = SimpleLogger::getLogLevel(in_stack_fffffffffffffee8), 3 < iVar1)) {
    in_stack_fffffffffffffed8 = local_18;
    SimpleLogger::put(local_8,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/greensky00[P]simple_logger/example/crash_example.cc"
                      ,"thread_sample",9,"new thread, wait %zu seconds");
  }
  switch(local_10) {
  case 0:
    std::__cxx11::string::string(local_38);
    TestSuite::sleep_sec(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(local_38);
    break;
  case 1:
    std::__cxx11::string::string(local_68);
    TestSuite::sleep_sec(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(local_68);
    break;
  case 2:
    std::__cxx11::string::string(local_88);
    TestSuite::sleep_sec(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(local_88);
    break;
  case 3:
    std::__cxx11::string::string(local_a8);
    TestSuite::sleep_sec(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(local_a8);
    break;
  default:
    sec_00 = local_18;
    std::__cxx11::string::string(local_c8);
    TestSuite::sleep_sec((size_t)sec_00,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(local_c8);
  }
  return;
}

Assistant:

void thread_sample(SimpleLogger* ll, size_t id) {
    size_t sec = 5;
    _log_info(ll, "new thread, wait %zu seconds", sec);
    switch (id) {
    case 0:
        TestSuite::sleep_sec(sec);
        break;
    case 1:
        TestSuite::sleep_sec(sec);
        break;
    case 2:
        TestSuite::sleep_sec(sec);
        break;
    case 3:
        TestSuite::sleep_sec(sec);
        break;
    default:
        TestSuite::sleep_sec(sec);
        break;
    }
}